

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

Accel * build_accel(Accel *__return_storage_ptr__,ThreadPool *thread_pool,
                   vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                   *tris,Options *options)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  anon_class_16_2_4c4d9b9a __comp;
  pointer pBVar1;
  size_type sVar2;
  ThreadPool *pTVar3;
  size_type sVar4;
  size_t sVar5;
  unsigned_long *puVar6;
  Task *pTVar7;
  undefined4 local_a94;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_a08;
  anon_class_16_2_e3848ef7 local_940;
  anon_class_16_2_e3848ef7 local_930;
  span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> local_920;
  span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL> local_910;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> local_900;
  undefined1 auStack_8d0 [8];
  Config config;
  anon_class_24_3_9fa53d14 local_890;
  allocator<bvh::v2::Vec<float,_3UL>_> local_871;
  undefined1 local_870 [8];
  vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> centers;
  allocator<bvh::v2::BBox<float,_3UL>_> local_841;
  undefined1 local_840 [8];
  vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> bboxes;
  ParallelExecutor executor;
  Options *options_local;
  vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *tris_local;
  ThreadPool *thread_pool_local;
  Accel *accel;
  anon_class_40_3_92fce145 local_7e8;
  Task local_7b8;
  _Manager_type local_798;
  unsigned_long local_790;
  size_t next;
  size_t i;
  unsigned_long local_778;
  _Manager_type local_770;
  unsigned_long chunk_size;
  ThreadPool *local_760;
  size_t local_758;
  pointer *local_750;
  Config local_738;
  Config local_728;
  pointer local_6e8;
  pointer pVStack_6e0;
  pointer local_6d8;
  pointer pBStack_6d0;
  undefined1 local_6c1;
  pointer local_6c0;
  pointer local_6b8;
  pointer local_6b0;
  pointer local_6a8;
  Config *local_6a0;
  ThreadPool *local_698;
  pointer local_690;
  pointer pVStack_688;
  span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL> local_680;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_670;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *bvh;
  anon_class_32_3_6bb9c804_conflict local_658;
  Task local_638;
  _Manager_type local_618;
  unsigned_long local_610;
  size_t next_1;
  size_t i_1;
  unsigned_long local_5f8;
  _Manager_type local_5f0;
  unsigned_long chunk_size_1;
  ThreadPool *local_5e0;
  size_t local_5d8;
  pointer *local_5d0;
  anon_class_32_3_6bb9c804_conflict local_5b8;
  Task local_590;
  _Manager_type local_570;
  unsigned_long local_568;
  size_t next_2;
  size_t i_2;
  unsigned_long local_550;
  _Manager_type local_548;
  unsigned_long chunk_size_2;
  ThreadPool *local_538;
  size_t local_530;
  pointer *local_528;
  Config local_510;
  pointer local_500;
  pointer local_4f8;
  pointer local_4f0;
  pointer local_4e8;
  undefined1 local_4d9;
  pointer local_4d8;
  pointer local_4d0;
  pointer local_4c8;
  pointer local_4c0;
  Config *local_4b8;
  pointer local_4b0;
  pointer local_4a8;
  pointer local_4a0;
  pointer local_498;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_490;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *bvh_1;
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  local_478;
  undefined1 local_460 [8];
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  mini_trees;
  undefined1 local_428 [8];
  MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> builder;
  undefined1 auStack_3b8 [8];
  Config mini_tree_config;
  BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL> local_340;
  Config *local_2f8;
  pointer local_2f0;
  pointer local_2e8;
  pointer local_2e0;
  pointer local_2d8;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_2d0;
  pointer local_2b8;
  pointer local_2b0;
  pointer local_2a8;
  pointer local_2a0;
  SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> local_298;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1e0;
  pointer local_1c8;
  pointer local_1c0;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_1b8;
  unsigned_long *local_1b0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1a8;
  allocator<unsigned_long> local_189;
  pointer local_188;
  pointer local_180;
  pointer local_178;
  pointer local_170;
  Config *local_168;
  BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL> *local_160;
  pointer local_158;
  pointer local_150;
  span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL> local_148;
  Config *local_138;
  BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL> *local_130;
  span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> local_128;
  span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL> local_118;
  span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> *local_108;
  size_t *local_100;
  unsigned_long *local_f8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_f0;
  unsigned_long *local_e8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_e0;
  size_t local_d8;
  size_t axis;
  pointer local_c0;
  pointer local_b8;
  pointer local_b0;
  pointer local_a8;
  Config *local_a0;
  SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_98;
  span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> local_90;
  span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL> local_80;
  Config *local_70;
  SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_68;
  span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> local_60;
  span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL> local_50;
  Config *local_40;
  ThreadPool *local_38;
  ParallelExecutor *local_30;
  span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> local_28;
  span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL> local_18;
  
  ::bvh::v2::ParallelExecutor::ParallelExecutor
            ((ParallelExecutor *)
             &bboxes.
              super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,thread_pool,0x400);
  sVar2 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::size
                    (tris);
  std::allocator<bvh::v2::BBox<float,_3UL>_>::allocator(&local_841);
  std::vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>::vector
            ((vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> *)
             local_840,sVar2,&local_841);
  std::allocator<bvh::v2::BBox<float,_3UL>_>::~allocator(&local_841);
  sVar2 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::size
                    (tris);
  std::allocator<bvh::v2::Vec<float,_3UL>_>::allocator(&local_871);
  std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::vector
            ((vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> *)
             local_870,sVar2,&local_871);
  std::allocator<bvh::v2::Vec<float,_3UL>_>::~allocator(&local_871);
  pTVar3 = (ThreadPool *)
           std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::size
                     (tris);
  local_890.bboxes =
       (vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> *)local_840;
  local_890.centers =
       (vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> *)local_870;
  local_750 = &bboxes.
               super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_758 = 0;
  chunk_size = (unsigned_long)&local_890;
  local_890.tris = tris;
  local_760 = pTVar3;
  if (pTVar3 < executor.thread_pool) {
    build_accel::anon_class_24_3_9fa53d14::operator()
              ((anon_class_24_3_9fa53d14 *)chunk_size,0,(size_t)pTVar3);
  }
  else {
    local_778 = 1;
    sVar5 = ::bvh::v2::ThreadPool::get_thread_count
                      ((ThreadPool *)
                       bboxes.
                       super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    i = (ulong)pTVar3 / sVar5;
    pTVar7 = (Task *)&i;
    puVar6 = std::max<unsigned_long>(&local_778,(unsigned_long *)pTVar7);
    local_770 = (_Manager_type)*puVar6;
    for (next = local_758; next < local_760; next = (size_t)(local_770 + next)) {
      local_798 = local_770 + next;
      puVar6 = std::min<unsigned_long>((unsigned_long *)&local_760,(unsigned_long *)&local_798);
      pBVar1 = bboxes.
               super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_7e8.next = *puVar6;
      local_7e8.loop.centers =
           *(vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> **)
            (chunk_size + 0x10);
      local_7e8.loop.bboxes =
           *(vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> **)
            chunk_size;
      local_7e8.loop.tris =
           *(vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> **)
            (chunk_size + 8);
      local_7e8.i = next;
      local_790 = local_7e8.next;
      std::function<void(unsigned_long)>::
      function<bvh::v2::ParallelExecutor::for_each<build_accel(bvh::v2::ThreadPool&,std::vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>>const&,Options_const&)::__0>(unsigned_long,unsigned_long,build_accel(bvh::v2::ThreadPool&,std::vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>>const&,Options_const&)::__0_const&)::_lambda(unsigned_long)_1_,void>
                ((function<void(unsigned_long)> *)&local_7b8,&local_7e8);
      pTVar7 = &local_7b8;
      ::bvh::v2::ThreadPool::push((ThreadPool *)pBVar1,pTVar7);
      std::function<void_(unsigned_long)>::~function(&local_7b8);
    }
    ::bvh::v2::ThreadPool::wait
              ((ThreadPool *)
               bboxes.
               super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,pTVar7);
  }
  config.parallel_threshold._7_1_ = 0;
  Accel::Accel(__return_storage_ptr__);
  ::bvh::v2::DefaultBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Config::Config
            ((Config *)auStack_8d0);
  config.super_Config.max_leaf_size._0_4_ = options->quality;
  std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::
  span<std::vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>_&>
            (&local_910,
             (vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> *)
             local_840);
  std::span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL>::
  span<std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>_&>
            (&local_920,
             (vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> *)
             local_870);
  local_670 = &local_900;
  local_680._M_ptr = local_910._M_ptr;
  local_680._M_extent._M_extent_value = local_910._M_extent._M_extent_value;
  local_690 = (pointer)local_920._M_ptr;
  pVStack_688 = (pointer)local_920._M_extent._M_extent_value;
  local_6a0 = (Config *)auStack_8d0;
  local_698 = thread_pool;
  sVar2 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_680);
  pTVar3 = local_698;
  if (sVar2 < local_6a0[1].sah.prim_offset_) {
    local_6b0 = local_680._M_ptr;
    local_6a8 = (pointer)local_680._M_extent._M_extent_value;
    local_6c0 = local_690;
    local_6b8 = pVStack_688;
    local_490 = &local_900;
    local_4a0 = local_680._M_ptr;
    local_498 = (pointer)local_680._M_extent._M_extent_value;
    local_4b0 = local_690;
    local_4a8 = pVStack_688;
    local_4b8 = local_6a0;
    if ((int)local_6a0[1].sah.log_cluster_size_ == 0) {
      local_4c8 = local_680._M_ptr;
      local_4c0 = (pointer)local_680._M_extent._M_extent_value;
      local_4d8 = local_690;
      local_4d0 = pVStack_688;
      local_2d0 = &local_900;
      local_2e0 = local_680._M_ptr;
      local_2d8 = (pointer)local_680._M_extent._M_extent_value;
      local_2f0 = local_690;
      local_2e8 = pVStack_688;
      local_2f8 = local_6a0;
      local_148._M_ptr = local_680._M_ptr;
      local_148._M_extent._M_extent_value = local_680._M_extent._M_extent_value;
      local_158 = local_690;
      local_150 = pVStack_688;
      local_160 = &local_340;
      local_168 = local_6a0;
      local_178 = local_680._M_ptr;
      local_170 = (pointer)local_680._M_extent._M_extent_value;
      local_188 = local_690;
      local_180 = pVStack_688;
      local_118._M_ptr = local_680._M_ptr;
      local_118._M_extent._M_extent_value = local_680._M_extent._M_extent_value;
      local_128._M_ptr = (pointer)local_690;
      local_128._M_extent._M_extent_value = (size_t)pVStack_688;
      local_138 = local_6a0;
      local_340.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.
      _vptr_TopDownSahBuilder = (_func_int **)&PTR___cxa_pure_virtual_00180cd8;
      local_340.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.bboxes_._M_ptr =
           local_680._M_ptr;
      local_340.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.bboxes_._M_extent.
      _M_extent_value = local_680._M_extent._M_extent_value;
      local_340.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.centers_._M_ptr =
           (pointer)local_690;
      local_340.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.centers_._M_extent.
      _M_extent_value = (size_t)pVStack_688;
      local_340.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.config_ = local_6a0;
      local_130 = local_160;
      sVar2 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_118);
      sVar4 = std::span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL>::size(&local_128);
      if (sVar2 != sVar4) {
        __assert_fail("bboxes.size() == centers.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/top_down_sah_builder.h"
                      ,0x3f,
                      "bvh::v2::TopDownSahBuilder<bvh::v2::Node<float, 3>>::TopDownSahBuilder(std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>]"
                     );
      }
      if (local_138->max_leaf_size < local_138->min_leaf_size) {
        __assert_fail("config.min_leaf_size <= config.max_leaf_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/top_down_sah_builder.h"
                      ,0x40,
                      "bvh::v2::TopDownSahBuilder<bvh::v2::Node<float, 3>>::TopDownSahBuilder(std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>]"
                     );
      }
      local_340.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.
      _vptr_TopDownSahBuilder = (_func_int **)&PTR_get_prim_ids_00180c90;
      sVar2 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_148);
      std::allocator<unsigned_long>::allocator(&local_189);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_340.prim_ids_,sVar2,&local_189);
      std::allocator<unsigned_long>::~allocator(&local_189);
      local_1a8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&local_340.prim_ids_);
      local_1b0 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            (&local_340.prim_ids_);
      std::
      iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
                (local_1a8,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_1b0,0);
      ::bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::build
                (&local_900,
                 &local_340.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>);
      ::bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL>::~BinnedSahBuilder
                (&local_340);
    }
    else {
      local_4d9 = 0;
      local_4f0 = local_680._M_ptr;
      local_4e8 = (pointer)local_680._M_extent._M_extent_value;
      local_500 = local_690;
      local_4f8 = pVStack_688;
      local_1b8 = &local_900;
      local_1c8 = local_680._M_ptr;
      local_1c0 = (pointer)local_680._M_extent._M_extent_value;
      local_1e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_690;
      local_1e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pVStack_688;
      local_1e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_6a0;
      local_2a8 = local_680._M_ptr;
      local_2a0 = (pointer)local_680._M_extent._M_extent_value;
      local_2b8 = local_690;
      local_2b0 = pVStack_688;
      local_80._M_ptr = local_680._M_ptr;
      local_80._M_extent._M_extent_value = local_680._M_extent._M_extent_value;
      local_90._M_ptr = (pointer)local_690;
      local_90._M_extent._M_extent_value = (size_t)pVStack_688;
      local_98 = &local_298;
      local_a0 = local_6a0;
      local_b0 = local_680._M_ptr;
      local_a8 = (pointer)local_680._M_extent._M_extent_value;
      local_c0 = local_690;
      local_b8 = pVStack_688;
      local_50._M_ptr = local_680._M_ptr;
      local_50._M_extent._M_extent_value = local_680._M_extent._M_extent_value;
      local_60._M_ptr = (pointer)local_690;
      local_60._M_extent._M_extent_value = (size_t)pVStack_688;
      local_70 = local_6a0;
      local_298.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.
      _vptr_TopDownSahBuilder = (_func_int **)&PTR___cxa_pure_virtual_00180cd8;
      local_298.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.bboxes_._M_ptr =
           local_680._M_ptr;
      local_298.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.bboxes_._M_extent.
      _M_extent_value = local_680._M_extent._M_extent_value;
      local_298.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.centers_._M_ptr =
           (pointer)local_690;
      local_298.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.centers_._M_extent.
      _M_extent_value = (size_t)pVStack_688;
      local_298.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.config_ = local_6a0;
      local_68 = local_98;
      sVar2 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_50);
      sVar4 = std::span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL>::size(&local_60);
      if (sVar2 != sVar4) {
        __assert_fail("bboxes.size() == centers.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/top_down_sah_builder.h"
                      ,0x3f,
                      "bvh::v2::TopDownSahBuilder<bvh::v2::Node<float, 3>>::TopDownSahBuilder(std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>]"
                     );
      }
      if (local_70->max_leaf_size < local_70->min_leaf_size) {
        __assert_fail("config.min_leaf_size <= config.max_leaf_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/top_down_sah_builder.h"
                      ,0x40,
                      "bvh::v2::TopDownSahBuilder<bvh::v2::Node<float, 3>>::TopDownSahBuilder(std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>]"
                     );
      }
      local_298.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.
      _vptr_TopDownSahBuilder = (_func_int **)&PTR_get_prim_ids_00180cf8;
      std::vector<bool,_std::allocator<bool>_>::vector(&local_298.marks_);
      std::vector<float,_std::allocator<float>_>::vector(&local_298.accum_);
      local_a08 = local_298.prim_ids_;
      do {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_a08);
        local_a08 = local_a08 + 1;
      } while (local_a08 != &local_1e0);
      sVar2 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_80);
      std::vector<bool,_std::allocator<bool>_>::resize(&local_298.marks_,sVar2,false);
      sVar2 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_80);
      std::vector<float,_std::allocator<float>_>::resize(&local_298.accum_,sVar2);
      for (local_d8 = 0; local_d8 < 3; local_d8 = local_d8 + 1) {
        this = local_298.prim_ids_ + local_d8;
        sVar2 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_80);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this,sVar2);
        local_e0._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       (local_298.prim_ids_ + local_d8);
        local_e8 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             (local_298.prim_ids_ + local_d8);
        std::
        iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
                  (local_e0,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )local_e8,0);
        local_f0._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       (local_298.prim_ids_ + local_d8);
        local_f8 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             (local_298.prim_ids_ + local_d8);
        local_108 = &local_90;
        local_100 = &local_d8;
        __comp.axis = local_100;
        __comp.centers = local_108;
        std::
        sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,bvh::v2::SweepSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::SweepSahBuilder(std::span<bvh::v2::BBox<float,3ul>const,18446744073709551615ul>,std::span<bvh::v2::Vec<float,3ul>const,18446744073709551615ul>,bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(unsigned_long,unsigned_long)_1_>
                  (local_f0,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )local_f8,__comp);
      }
      ::bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::build
                (&local_900,
                 &local_298.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>);
      ::bvh::v2::SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::~SweepSahBuilder
                (&local_298);
      if ((int)local_4b8[1].sah.log_cluster_size_ == 2) {
        local_510.batch_size_ratio = 0.05;
        local_510.max_iter_count = 3;
        ::bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::optimize
                  (&local_900,&local_510);
      }
      local_4d9 = 1;
    }
  }
  else {
    local_6c1 = 0;
    local_6d8 = local_680._M_ptr;
    pBStack_6d0 = (pointer)local_680._M_extent._M_extent_value;
    local_6e8 = local_690;
    pVStack_6e0 = pVStack_688;
    mini_tree_config.log2_grid_dim = (size_t)local_6a0;
    ::bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::Config::Config
              ((Config *)auStack_3b8);
    mini_tree_config.super_Config.min_leaf_size = *(size_t *)(mini_tree_config.log2_grid_dim + 0x20)
    ;
    auStack_3b8 = *(undefined1 (*) [8])mini_tree_config.log2_grid_dim;
    mini_tree_config.super_Config.sah.log_cluster_size_ =
         *(size_t *)(mini_tree_config.log2_grid_dim + 8);
    mini_tree_config.super_Config.sah.prim_offset_ =
         *(size_t *)(mini_tree_config.log2_grid_dim + 0x10);
    mini_tree_config.super_Config.sah._16_8_ =
         *(undefined8 *)(mini_tree_config.log2_grid_dim + 0x18);
    mini_tree_config.super_Config.max_leaf_size._0_1_ =
         -(*(int *)(mini_tree_config.log2_grid_dim + 0x28) != 0) & 1;
    local_a94 = 0x3c23d70a;
    if (*(int *)(mini_tree_config.log2_grid_dim + 0x28) != 2) {
      local_a94 = 0x3dcccccd;
    }
    mini_tree_config.super_Config.max_leaf_size._4_4_ = local_a94;
    mini_tree_config._40_8_ = *(undefined8 *)(mini_tree_config.log2_grid_dim + 0x30);
    memcpy(&local_728,auStack_3b8,0x40);
    builder.config_ = &local_728;
    mini_trees.
    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_6e8;
    local_18._M_ptr = local_6d8;
    local_18._M_extent._M_extent_value = (size_t)pBStack_6d0;
    local_28._M_ptr = (pointer)local_6e8;
    local_28._M_extent._M_extent_value = (size_t)pVStack_6e0;
    local_30 = (ParallelExecutor *)local_428;
    local_38 = pTVar3;
    local_40 = builder.config_;
    ::bvh::v2::ParallelExecutor::ParallelExecutor(local_30,pTVar3,0x400);
    builder.executor_.parallel_threshold = (size_t)local_18._M_ptr;
    builder.bboxes_._M_ptr = (pointer)local_18._M_extent._M_extent_value;
    builder.bboxes_._M_extent._M_extent_value = (size_t)local_28._M_ptr;
    builder.centers_._M_ptr = (pointer)local_28._M_extent._M_extent_value;
    builder.centers_._M_extent._M_extent_value = (size_t)local_40;
    sVar2 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_18);
    sVar4 = std::span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL>::size(&local_28);
    if (sVar2 != sVar4) {
      __assert_fail("bboxes.size() == centers.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/mini_tree_builder.h"
                    ,0x9d,
                    "bvh::v2::MiniTreeBuilder<bvh::v2::Node<float, 3>>::MiniTreeBuilder(ThreadPool &, std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>, MortonCode = unsigned int]"
                   );
    }
    ::bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::build_mini_trees
              ((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                *)local_460,
               (MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *)local_428);
    if (((builder.config_)->enable_pruning & 1U) != 0) {
      ::bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::
      prune_mini_trees(&local_478,
                       (MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *)
                       local_428,
                       (vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                        *)local_460);
      std::
      vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ::operator=((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                   *)local_460,&local_478);
      std::
      vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ::~vector(&local_478);
    }
    ::bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::build_top_bvh
              (&local_900,
               (MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *)local_428,
               (vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                *)local_460);
    std::
    vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
    ::~vector((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
               *)local_460);
    if ((int)local_6a0[1].sah.log_cluster_size_ == 2) {
      local_738.batch_size_ratio = 0.05;
      local_738.max_iter_count = 3;
      ::bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::optimize
                (local_698,&local_900,&local_738);
    }
    local_6c1 = 1;
  }
  ::bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::operator=
            (&__return_storage_ptr__->bvh,&local_900);
  ::bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::~Bvh(&local_900);
  sVar2 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::size
                    (tris);
  std::vector<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>::
  resize(&__return_storage_ptr__->tris,sVar2);
  if ((options->permute_prims & 1U) == 0) {
    pTVar3 = (ThreadPool *)
             std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::size
                       (tris);
    local_528 = &bboxes.
                 super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_530 = 0;
    chunk_size_2 = (unsigned_long)&local_940;
    local_940.accel = __return_storage_ptr__;
    local_940.tris = tris;
    local_538 = pTVar3;
    if (pTVar3 < executor.thread_pool) {
      build_accel::anon_class_16_2_e3848ef7::operator()
                ((anon_class_16_2_e3848ef7 *)chunk_size_2,0,(size_t)pTVar3);
    }
    else {
      local_550 = 1;
      sVar5 = ::bvh::v2::ThreadPool::get_thread_count
                        ((ThreadPool *)
                         bboxes.
                         super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      i_2 = (ulong)pTVar3 / sVar5;
      pTVar7 = (Task *)&i_2;
      puVar6 = std::max<unsigned_long>(&local_550,(unsigned_long *)pTVar7);
      local_548 = (_Manager_type)*puVar6;
      for (next_2 = local_530; next_2 < local_538; next_2 = (size_t)(local_548 + next_2)) {
        local_570 = local_548 + next_2;
        puVar6 = std::min<unsigned_long>((unsigned_long *)&local_538,(unsigned_long *)&local_570);
        pBVar1 = bboxes.
                 super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_5b8.next = *puVar6;
        local_5b8.loop.accel = *(Accel **)chunk_size_2;
        local_5b8.loop.tris =
             *(vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> **)
              (chunk_size_2 + 8);
        local_5b8.i = next_2;
        local_568 = local_5b8.next;
        std::function<void(unsigned_long)>::
        function<bvh::v2::ParallelExecutor::for_each<build_accel(bvh::v2::ThreadPool&,std::vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>>const&,Options_const&)::__2>(unsigned_long,unsigned_long,build_accel(bvh::v2::ThreadPool&,std::vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>>const&,Options_const&)::__2_const&)::_lambda(unsigned_long)_1_,void>
                  ((function<void(unsigned_long)> *)&local_590,&local_5b8);
        pTVar7 = &local_590;
        ::bvh::v2::ThreadPool::push((ThreadPool *)pBVar1,pTVar7);
        std::function<void_(unsigned_long)>::~function(&local_590);
      }
      ::bvh::v2::ThreadPool::wait
                ((ThreadPool *)
                 bboxes.
                 super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,pTVar7);
    }
  }
  else {
    pTVar3 = (ThreadPool *)
             std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::size
                       (tris);
    local_5d0 = &bboxes.
                 super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_5d8 = 0;
    chunk_size_1 = (unsigned_long)&local_930;
    local_930.accel = __return_storage_ptr__;
    local_930.tris = tris;
    local_5e0 = pTVar3;
    if (pTVar3 < executor.thread_pool) {
      build_accel::anon_class_16_2_e3848ef7::operator()
                ((anon_class_16_2_e3848ef7 *)chunk_size_1,0,(size_t)pTVar3);
    }
    else {
      local_5f8 = 1;
      sVar5 = ::bvh::v2::ThreadPool::get_thread_count
                        ((ThreadPool *)
                         bboxes.
                         super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      i_1 = (ulong)pTVar3 / sVar5;
      pTVar7 = (Task *)&i_1;
      puVar6 = std::max<unsigned_long>(&local_5f8,(unsigned_long *)pTVar7);
      local_5f0 = (_Manager_type)*puVar6;
      for (next_1 = local_5d8; next_1 < local_5e0; next_1 = (size_t)(local_5f0 + next_1)) {
        local_618 = local_5f0 + next_1;
        puVar6 = std::min<unsigned_long>((unsigned_long *)&local_5e0,(unsigned_long *)&local_618);
        pBVar1 = bboxes.
                 super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_658.next = *puVar6;
        local_658.loop.accel = *(Accel **)chunk_size_1;
        local_658.loop.tris =
             *(vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> **)
              (chunk_size_1 + 8);
        local_658.i = next_1;
        local_610 = local_658.next;
        std::function<void(unsigned_long)>::
        function<bvh::v2::ParallelExecutor::for_each<build_accel(bvh::v2::ThreadPool&,std::vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>>const&,Options_const&)::__1>(unsigned_long,unsigned_long,build_accel(bvh::v2::ThreadPool&,std::vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>>const&,Options_const&)::__1_const&)::_lambda(unsigned_long)_1_,void>
                  ((function<void(unsigned_long)> *)&local_638,&local_658);
        pTVar7 = &local_638;
        ::bvh::v2::ThreadPool::push((ThreadPool *)pBVar1,pTVar7);
        std::function<void_(unsigned_long)>::~function(&local_638);
      }
      ::bvh::v2::ThreadPool::wait
                ((ThreadPool *)
                 bboxes.
                 super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,pTVar7);
    }
  }
  config.parallel_threshold._7_1_ = 1;
  std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::~vector
            ((vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> *)
             local_870);
  std::vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>::~vector
            ((vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> *)
             local_840);
  return __return_storage_ptr__;
}

Assistant:

static Accel build_accel(bvh::v2::ThreadPool& thread_pool, const std::vector<Tri>& tris, const Options& options) {
    bvh::v2::ParallelExecutor executor(thread_pool);

    std::vector<BBox> bboxes(tris.size());
    std::vector<Vec3> centers(tris.size());
    executor.for_each(0, tris.size(), [&] (size_t begin, size_t end) {
        for (size_t i = begin; i < end; ++i) {
            bboxes[i]  = tris[i].get_bbox();
            centers[i] = tris[i].get_center();
        }
    });

    Accel accel;

    typename bvh::v2::DefaultBuilder<Node>::Config config;
    config.quality = options.quality;
    accel.bvh = bvh::v2::DefaultBuilder<Node>::build(thread_pool, bboxes, centers, config);

    accel.tris.resize(tris.size());
    if (options.permute_prims) {
        executor.for_each(0, tris.size(), [&] (size_t begin, size_t end) {
            for (size_t i = begin; i < end; ++i)
                accel.tris[i] = tris[accel.bvh.prim_ids[i]];
        });
    } else {
        executor.for_each(0, tris.size(), [&] (size_t begin, size_t end) {
            for (size_t i = begin; i < end; ++i)
                accel.tris[i] = tris[i];
        });
    }

    return accel;
}